

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex-estimation-test.cpp
# Opt level: O0

int testConstant(void)

{
  uint uVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  ostream *poVar4;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  Matrix *pMVar5;
  Scalar *pSVar6;
  void *this_00;
  Matrix<double,_4,_4,_0,_4,_4> local_838;
  Matrix4 local_7b8;
  Matrix4 local_738;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_6b8;
  Type local_6a0;
  undefined1 local_668 [8];
  Vector4 v;
  undefined1 local_618 [8];
  Matrix4 m;
  Matrix<double,__1,_1,_0,__1,_1> local_560;
  Type local_550;
  Type local_518;
  Matrix<double,__1,_1,_0,__1,_1> local_4e0;
  Type local_4d0;
  ConstantReturnType local_498;
  undefined1 local_480 [8];
  Vector v2;
  uint local_464;
  undefined1 local_460 [4];
  uint i_1;
  ofstream f;
  Matrix<double,__1,__1,_0,__1,__1> local_260;
  IndexedMatrixArray local_248 [8];
  IndexedMatrixArray xh;
  undefined1 local_1f0 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  contactPositions;
  undefined1 local_1c0 [8];
  Vector xh0;
  Matrix local_198;
  Matrix local_180;
  uint local_164;
  undefined1 local_160 [4];
  uint i;
  undefined1 local_148 [8];
  Vector uConstant;
  undefined1 local_120 [8];
  Vector yConstant;
  undefined1 local_100 [8];
  Vector3 contact;
  undefined1 local_d8 [8];
  IndexedMatrixArray u;
  IndexedMatrixArray local_80 [8];
  IndexedMatrixArray y;
  uint inputSize;
  uint measurementSize;
  uint stateSize;
  double dt;
  uint kmax;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(local_80);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_d8);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)local_100,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)&yConstant.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_100,0);
  *pSVar2 = 0.311236;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_100,1);
  *pSVar2 = -0.355773;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_100,2);
  *pSVar2 = 1.1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &uConstant.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,6,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_120,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&uConstant.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_120,1);
  *pSVar3 = 9.8;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)local_160,0xf,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_148,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_160);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_148,2);
  *pSVar3 = 1.8;
  for (local_164 = 1; local_164 < 0x1389; local_164 = local_164 + 1) {
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_180,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_120);
    stateObservation::IndexedMatrixArray::setValue(local_80,&local_180,local_164);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_180);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_198,
               (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_148);
    stateObservation::IndexedMatrixArray::setValue
              ((IndexedMatrixArray *)local_d8,&local_198,local_164);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_198);
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)
             &xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_148);
  stateObservation::IndexedMatrixArray::pushBack
            ((IndexedMatrixArray *)local_d8,
             (Matrix *)
             &xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             &xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &contactPositions.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x12,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_1c0,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&contactPositions.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_1f0);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_1f0,(value_type *)local_100);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_260,
             (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1c0);
  stateObservation::examples::offlineEKFFlexibilityEstimation
            (local_248,local_80,(Matrix *)local_d8,(uint)&local_260,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)0x1,0.001,(IndexedMatrixArray *)local_1f0,(IndexedMatrixArray *)0x0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_260);
  std::ofstream::ofstream(local_460);
  std::ofstream::open(local_460,"trajectory.dat",0x10);
  local_464 = stateObservation::IndexedMatrixArray::getFirstIndex(local_248);
  while( true ) {
    uVar1 = stateObservation::IndexedMatrixArray::getLastIndex(local_248);
    if (uVar1 < local_464) break;
    poVar4 = (ostream *)std::ostream::operator<<(local_460,local_464);
    poVar4 = std::operator<<(poVar4," ");
    this = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           stateObservation::IndexedMatrixArray::operator[](local_248,local_464);
    v2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose(this);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&v2.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero(&local_498,6,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_480,&local_498);
    pMVar5 = stateObservation::IndexedMatrixArray::operator[](local_248,local_464);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_4e0,pMVar5);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_4d0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4e0,0,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              (&local_518,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_480,3);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::operator=(&local_518,&local_4d0)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_4e0);
    pMVar5 = stateObservation::IndexedMatrixArray::operator[](local_248,local_464);
    Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((Matrix<double,_1,1,0,_1,1> *)&local_560,pMVar5);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_550,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_560,3,3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
              ((Type *)(m.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array + 0xf),
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_480,3);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::operator=
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)
               (m.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),&local_550);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_560);
    Eigen::Matrix<double,6,1,0,6,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,6,1,0,6,1> *)
               (v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),(EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_480);
    stateObservation::kine::vector6ToHomogeneousMatrix
              ((Matrix4 *)local_618,
               (Vector6 *)
               (v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3));
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_668);
    Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
              (&local_6a0,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_668,3);
    Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false> *)&local_6a0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_100);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)local_668,3);
    *pSVar6 = 1.0;
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              (&local_838,(Matrix<double,_4,_4,_0,_4,_4> *)local_618);
    stateObservation::kine::invertHomoMatrix(&local_7b8,&local_838);
    stateObservation::kine::invertHomoMatrix(&local_738,&local_7b8);
    Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator-
              (&local_6b8,(MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_618,
               (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_738);
    poVar4 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                *)&local_6b8);
    this_00 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_480);
    local_464 = local_464 + 1;
  }
  std::ofstream::~ofstream(local_460);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_248);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)local_1f0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_1c0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_148);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_120);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray((IndexedMatrixArray *)local_d8);
  stateObservation::IndexedMatrixArray::~IndexedMatrixArray(local_80);
  return 0;
}

Assistant:

int testConstant()
{
    /// The number of samples
    const unsigned kmax=5000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    Vector3 contact(Vector3::Zero());

    contact[0]=0.31123600000000001;
    contact[1]=-0.35577300000000001;
    contact[2]=1.1000000000000001;

    Vector yConstant = Vector::Zero(measurementSize,1);
    yConstant[1]=9.8;



    Vector uConstant = Vector::Zero(inputSize,1);
    uConstant[2]=1.8;

    {
        for ( unsigned i=1 ; i<kmax+1 ; ++i )
        {
            y.setValue(yConstant,i);
            u.setValue(uConstant,i);
        }
    }

    u.pushBack(uConstant);

    ///the initalization of a random estimation of the initial state
    Vector xh0=Vector::Zero(stateSize,1);

    std::vector<Vector3, Eigen::aligned_allocator<Vector3> > contactPositions;

    contactPositions.push_back(contact);

    stateObservation::IndexedMatrixArray xh=
        stateObservation::examples::offlineEKFFlexibilityEstimation
        (y,u,xh0,1,contactPositions,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    ///the reconstruction of the state
    for (unsigned i=xh.getFirstIndex();i<=xh.getLastIndex();++i)
    {
       f << i<<" "<< xh[i].transpose()
          << std::endl;

       Vector v2 (Matrix::Zero(6,1));

       v2.head(3) = Vector(xh[i]).segment(kine::pos,3);
       v2.tail(3) = Vector(xh[i]).segment(kine::ori,3);

       Matrix4 m= kine::vector6ToHomogeneousMatrix(v2);
       Vector4 v;
       v.head(3)=contact;
       v[3]=1;

       std::cout << m - kine::invertHomoMatrix(
                            kine::invertHomoMatrix(m))
                                        << std::endl << std::endl;

    }

    return 0;
}